

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O3

ScalarFunction * duckdb::MapKeysFun::GetFunction(void)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogicalType varargs;
  ScalarFunction *in_RDI;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe9c;
  undefined1 null_handling;
  undefined8 bind_lambda;
  vector<duckdb::LogicalType,_true> local_138;
  LogicalType local_118;
  LogicalType local_100;
  LogicalType local_e8;
  BaseScalarFunction local_d0;
  
  local_138.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_118,LIST);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 100;
  LogicalType::LogicalType(&local_100,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_100;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe94;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe9c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_138,&local_118,(scalar_function_t *)&stack0xfffffffffffffea8,MapKeysBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,null_handling,(bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_100);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffea8,(_Any_data *)&stack0xfffffffffffffea8,
               __destroy_functor);
  LogicalType::~LogicalType(&local_118);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_138);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  LogicalType::LogicalType(&local_e8,ANY);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_e8.id_;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       local_e8.physical_type_;
  peVar1 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_e8.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_e8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_e8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_e8);
  return in_RDI;
}

Assistant:

ScalarFunction MapKeysFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction function({}, LogicalTypeId::LIST, MapKeysFunction, MapKeysBind);
	function.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(function);
	function.varargs = LogicalType::ANY;
	return function;
}